

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL __thiscall
Js::GlobalObject::DeleteRootProperty
          (GlobalObject *this,PropertyId propertyId,PropertyOperationFlags flags)

{
  BOOL BVar1;
  int iVar2;
  RecyclableObject **ppRVar3;
  RecyclableObject *pRVar4;
  HostObjectBase **ppHVar5;
  HostObjectBase *pHVar6;
  PropertyOperationFlags flags_local;
  PropertyId propertyId_local;
  GlobalObject *this_local;
  
  BVar1 = RootObjectBase::HasRootProperty(&this->super_RootObjectBase,propertyId);
  if (BVar1 == 0) {
    ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                        ((WriteBarrierPtr *)&this->directHostObject);
    if (*ppRVar3 != (RecyclableObject *)0x0) {
      pRVar4 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->directHostObject);
      BVar1 = RecyclableObject::HasProperty(pRVar4,propertyId);
      if (BVar1 != 0) {
        pRVar4 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->directHostObject);
        iVar2 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x21])(pRVar4,(ulong)(uint)propertyId,(ulong)flags);
        return iVar2;
      }
    }
    ppHVar5 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar5 != (HostObjectBase *)0x0) {
      pRVar4 = (RecyclableObject *)
               Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                         (&(this->super_RootObjectBase).hostObject);
      BVar1 = RecyclableObject::HasProperty(pRVar4,propertyId);
      if (BVar1 != 0) {
        pHVar6 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                           (&(this->super_RootObjectBase).hostObject);
        BVar1 = (**(code **)(*(long *)pHVar6 + 0x108))(pHVar6,propertyId,flags);
        return BVar1;
      }
    }
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ =
         RootObjectBase::DeleteRootProperty(&this->super_RootObjectBase,propertyId,flags);
  }
  return this_local._4_4_;
}

Assistant:

BOOL GlobalObject::DeleteRootProperty(PropertyId propertyId, PropertyOperationFlags flags)
    {
        if (__super::HasRootProperty(propertyId))
        {
            return __super::DeleteRootProperty(propertyId, flags);
        }
        else if (this->directHostObject && this->directHostObject->HasProperty(propertyId))
        {
            return this->directHostObject->DeleteProperty(propertyId, flags);
        }
        else if (this->hostObject && this->hostObject->HasProperty(propertyId))
        {
            return this->hostObject->DeleteProperty(propertyId, flags);
        }

        // Non-existent property
        return TRUE;
    }